

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O3

FT_Error cf2_decoder_parse_charstrings
                   (PS_Decoder *decoder,FT_Byte *charstring_base,FT_ULong charstring_len)

{
  CF2_BlueRec *pCVar1;
  char cVar2;
  char cVar3;
  FT_Bool FVar4;
  FT_Bool FVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  FT_Face pFVar10;
  FT_Driver pFVar11;
  CFF_GlyphSlot pCVar12;
  CFF_SubFont pCVar13;
  FT_Service_CFFLoad pFVar14;
  FT_Pos FVar15;
  PS_Decoder *pPVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  FT_Bool *pFVar19;
  FT_Bool FVar20;
  int iVar21;
  CF2_F16Dot16 stemWidth;
  int iVar22;
  CF2_Font font;
  FT_Long FVar23;
  FT_Long FVar24;
  FT_Memory pFVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  FT_Bool FVar32;
  CF2_F16Dot16 CVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  PS_Decoder *decoder_1;
  uint uVar37;
  int iVar38;
  bool bVar39;
  int iVar40;
  int iVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  FT_UFast lenNormalizedV;
  FT_Error error;
  FT_UFast local_c4;
  CF2_BluesRec *local_c0;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  CF2_F16Dot16 *local_a8;
  FT_Error local_a0;
  CF2_F16Dot16 local_9c;
  FT_Fixed *local_98;
  FT_Bool *local_90;
  CF2_BlueRec *local_88;
  char local_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  CF2_BufferRec_ local_68;
  FT_Vector local_48;
  
  local_a0 = 0;
  FVar20 = (decoder->builder).is_t1;
  if ((FVar20 != '\0') && (decoder->current_subfont == (CFF_SubFont)0x0)) {
    return 8;
  }
  font = (CF2_Font)decoder->cf2_instance->data;
  if (font == (CF2_Font)0x0) {
    local_b8 = (decoder->builder).memory;
    decoder->cf2_instance->finalizer = cf2_free_instance;
    font = (CF2_Font)ft_mem_alloc(local_b8,0x290,&local_a0);
    decoder->cf2_instance->data = font;
    if (local_a0 != 0) {
      return 0x40;
    }
    font->memory = local_b8;
    if (FVar20 == '\0') {
      font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;
    }
    *(undefined8 *)&(font->outline).root.windingMomentum = 0;
    (font->outline).root.memory = (FT_Memory)0x0;
    (font->outline).root.error = (FT_Error *)0x0;
    (font->outline).decoder = (PS_Decoder *)0x0;
    (font->outline).root.quadTo = (CF2_Callback_Type)0x0;
    (font->outline).root.cubeTo = (CF2_Callback_Type)0x0;
    (font->outline).root.memory = local_b8;
    (font->outline).root.error = &font->error;
    (font->outline).root.moveTo = cf2_builder_moveTo;
    (font->outline).root.lineTo = cf2_builder_lineTo;
    (font->outline).root.cubeTo = cf2_builder_cubeTo;
  }
  font->decoder = decoder;
  (font->outline).decoder = decoder;
  pFVar10 = (decoder->builder).face;
  pFVar11 = pFVar10->driver;
  cVar2 = *(char *)((long)&pFVar11[1].root.clazz + 4);
  cVar3 = pFVar10->internal->no_stem_darkening;
  local_68.error = (FT_Error *)0x0;
  local_68.end = charstring_base + charstring_len;
  if (charstring_base == (FT_Byte *)0x0) {
    local_68.end = (FT_Byte *)0x0;
  }
  cStack_7c = '\0';
  cStack_7b = '\0';
  cStack_7a = '\0';
  cStack_79 = '\0';
  cStack_78 = '\0';
  cStack_77 = '\0';
  cStack_76 = '\0';
  cStack_75 = '\0';
  uStack_70 = 0;
  uStack_6c = 0;
  pCVar12 = (decoder->builder).glyph;
  FVar4 = pCVar12->hint;
  if (FVar4 == '\0') {
    iVar40 = 0x400;
    iVar43 = 0x400;
  }
  else {
    iVar40 = (int)pCVar12->x_scale + 0x20;
    iVar43 = (int)pCVar12->y_scale + 0x20;
    iVar40 = (int)(((uint)(iVar40 >> 0x1f) >> 0x1a) + iVar40) >> 6;
    iVar43 = (int)(((uint)(iVar43 >> 0x1f) >> 0x1a) + iVar43) >> 6;
  }
  FVar5 = pCVar12->scaled;
  local_80 = (char)iVar40;
  cStack_7f = (char)((uint)iVar40 >> 8);
  cStack_7e = (char)((uint)iVar40 >> 0x10);
  cStack_7d = (char)((uint)iVar40 >> 0x18);
  cStack_74 = (char)iVar43;
  cStack_73 = (char)((uint)iVar43 >> 8);
  cStack_72 = (char)((uint)iVar43 >> 0x10);
  cStack_71 = (char)((uint)iVar43 >> 0x18);
  if (FVar20 == '\0') {
    FVar32 = *(FT_Bool *)&pFVar10[4].autohint.data;
  }
  else {
    FVar32 = '\0';
  }
  font->isCFF2 = FVar32;
  font->isT1 = FVar20;
  uVar36 = (uint)(FVar4 != '\0');
  font->renderingFlags = uVar36;
  if ((FVar5 != '\0') && ((cVar3 == '\0' || ((cVar3 < '\0' && (cVar2 == '\0')))))) {
    font->renderingFlags = uVar36 | 2;
  }
  font->darkenParams[0] = *(FT_Int *)&pFVar11[1].root.library;
  font->darkenParams[1] = *(FT_Int *)((long)&pFVar11[1].root.library + 4);
  font->darkenParams[2] = *(FT_Int *)&pFVar11[1].root.memory;
  font->darkenParams[3] = *(FT_Int *)((long)&pFVar11[1].root.memory + 4);
  font->darkenParams[4] = *(FT_Int *)&pFVar11[1].clazz;
  font->darkenParams[5] = *(FT_Int *)((long)&pFVar11[1].clazz + 4);
  font->darkenParams[6] = *(FT_Int *)&pFVar11[1].faces_list.head;
  font->darkenParams[7] = *(FT_Int *)((long)&pFVar11[1].faces_list.head + 4);
  pFVar10 = (decoder->builder).face;
  uVar9 = pFVar10->units_per_EM;
  font->unitsPerEm = (uint)uVar9;
  local_68.start = charstring_base;
  local_68.ptr = charstring_base;
  if (FVar5 != '\0') {
    auVar41._0_4_ = -(uint)(0 < iVar40);
    auVar41._4_4_ = -(uint)(0 < iVar40);
    auVar41._8_4_ = -(uint)(0 < iVar43);
    auVar41._12_4_ = -(uint)(0 < iVar43);
    iVar21 = movmskpd((int)pFVar10,auVar41);
    if (iVar21 != 3) {
      return 0x24;
    }
    if ((short)uVar9 < 0) {
      return 0xa4;
    }
    local_b8 = (FT_Memory)CONCAT44(iVar43,iVar43);
    iStack_b0 = iVar43;
    iStack_ac = iVar43;
    FVar23 = FT_DivFix(0x7d00000,(ulong)uVar9 << 0x10);
    if ((int)(uint)FVar23 < iVar40) {
      return 0xa4;
    }
    if ((uint)FVar23 < (uint)local_b8) {
      return 0xa4;
    }
    decoder = font->decoder;
  }
  local_9c = 0;
  local_48.x = 0;
  local_48.y = 0;
  pFVar25 = (FT_Memory)(ulong)(uint)font->syntheticEmboldeningAmountX;
  CVar33 = font->syntheticEmboldeningAmountY;
  local_c4 = 0;
  local_98 = (FT_Fixed *)0x0;
  font->error = 0;
  pCVar13 = decoder->current_subfont;
  bVar39 = font->lastSubfont != pCVar13;
  if (bVar39) {
    font->lastSubfont = pCVar13;
  }
  if ((font->isT1 == '\0') && ((decoder->cff->vstore).dataCount != 0)) {
    pFVar14 = font->cffload;
    pFVar10 = (decoder->builder).face;
    local_b8 = pFVar25;
    iVar40 = (*(code *)(pFVar10[3].glyph)->linearVertAdvance)(pFVar10,&local_c4,0,&local_98);
    font->error = iVar40;
    if (iVar40 != 0) {
      return 3;
    }
    FVar20 = (*pFVar14->blend_check_vector)
                       (&pCVar13->blend,(pCVar13->private_dict).vsindex,local_c4,local_98);
    if (FVar20 != '\0') {
      (*pFVar14->load_private_dict)(decoder->cff,pCVar13,local_c4,local_98);
    }
    bVar39 = FVar20 != '\0' || bVar39;
    (font->blend).font = (pCVar13->blend).font;
    (font->blend).usedBV = '\0';
    font->vsindex = (pCVar13->private_dict).vsindex;
    font->lenNDV = local_c4;
    font->NDV = local_98;
    pFVar25 = local_b8;
  }
  lVar27 = (ulong)(((decoder->builder).face)->size->metrics).y_ppem << 0x10;
  iVar40 = (int)lVar27;
  if (font->ppem != iVar40) {
    font->ppem = iVar40;
    bVar39 = true;
  }
  uVar36 = font->renderingFlags;
  font->hinted = (byte)uVar36 & 1;
  auVar42[0] = -((char)(font->currentTransform).a == local_80);
  auVar42[1] = -(*(char *)((long)&(font->currentTransform).a + 1) == cStack_7f);
  auVar42[2] = -(*(char *)((long)&(font->currentTransform).a + 2) == cStack_7e);
  auVar42[3] = -(*(char *)((long)&(font->currentTransform).a + 3) == cStack_7d);
  auVar42[4] = -((char)(font->currentTransform).b == cStack_7c);
  auVar42[5] = -(*(char *)((long)&(font->currentTransform).b + 1) == cStack_7b);
  auVar42[6] = -(*(char *)((long)&(font->currentTransform).b + 2) == cStack_7a);
  auVar42[7] = -(*(char *)((long)&(font->currentTransform).b + 3) == cStack_79);
  auVar42[8] = -((char)(font->currentTransform).c == cStack_78);
  auVar42[9] = -(*(char *)((long)&(font->currentTransform).c + 1) == cStack_77);
  auVar42[10] = -(*(char *)((long)&(font->currentTransform).c + 2) == cStack_76);
  auVar42[0xb] = -(*(char *)((long)&(font->currentTransform).c + 3) == cStack_75);
  auVar42[0xc] = -((char)(font->currentTransform).d == cStack_74);
  auVar42[0xd] = -(*(char *)((long)&(font->currentTransform).d + 1) == cStack_73);
  auVar42[0xe] = -(*(char *)((long)&(font->currentTransform).d + 2) == cStack_72);
  auVar42[0xf] = -(*(char *)((long)&(font->currentTransform).d + 3) == cStack_71);
  if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe | (ushort)(auVar42[0xf] >> 7) << 0xf)
      == 0xffff) {
    if ((uVar36 & 2) != (uint)font->stemDarkened) goto LAB_0022de0d;
    if (!bVar39) goto LAB_0022e487;
  }
  else {
    uVar17 = CONCAT13(cStack_7d,CONCAT12(cStack_7e,CONCAT11(cStack_7f,local_80)));
    uVar18 = CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,cStack_78)));
    (font->currentTransform).a = uVar17;
    (font->currentTransform).b =
         (int)(CONCAT17(cStack_79,CONCAT16(cStack_7a,CONCAT15(cStack_7b,CONCAT14(cStack_7c,uVar17)))
                       ) >> 0x20);
    (font->currentTransform).c = uVar18;
    (font->currentTransform).d =
         (int)(CONCAT17(cStack_71,CONCAT16(cStack_72,CONCAT15(cStack_73,CONCAT14(cStack_74,uVar18)))
                       ) >> 0x20);
    (font->currentTransform).tx = 0;
    (font->currentTransform).ty = 0;
    uVar17 = CONCAT13(cStack_7d,CONCAT12(cStack_7e,CONCAT11(cStack_7f,local_80)));
    uVar18 = CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,cStack_78)));
    (font->innerTransform).a = uVar17;
    (font->innerTransform).b =
         (int)(CONCAT17(cStack_79,CONCAT16(cStack_7a,CONCAT15(cStack_7b,CONCAT14(cStack_7c,uVar17)))
                       ) >> 0x20);
    (font->innerTransform).c = uVar18;
    (font->innerTransform).d =
         (int)(CONCAT17(cStack_71,CONCAT16(cStack_72,CONCAT15(cStack_73,CONCAT14(cStack_74,uVar18)))
                       ) >> 0x20);
    (font->innerTransform).tx = uStack_70;
    (font->innerTransform).ty = uStack_6c;
    (font->outerTransform).a = 0x10000;
    (font->outerTransform).b = 0;
    (font->outerTransform).c = 0;
    (font->outerTransform).d = 0x10000;
    if ((uVar36 & 2) != (uint)font->stemDarkened) {
LAB_0022de0d:
      font->stemDarkened = (FT_Bool)((uVar36 & 2) >> 1);
    }
  }
  local_90 = &font->stemDarkened;
  iVar43 = 1000;
  if (font->unitsPerEm != 0) {
    iVar43 = font->unitsPerEm;
  }
  FVar23 = 0x40000;
  if (0x40000 < iVar40) {
    FVar23 = lVar27;
  }
  iVar40 = (int)(decoder->current_subfont->private_dict).standard_height;
  stemWidth = iVar40 << 0x10;
  font->stdVW = stemWidth;
  iVar21 = (int)(0x3e80000 / (long)iVar43);
  local_b8 = (FT_Memory)(long)iVar21;
  local_c0 = (CF2_BluesRec *)CONCAT44(local_c0._4_4_,CVar33);
  if (iVar40 << 0x10 < 1) {
    FVar24 = FT_DivFix(0x4b0000,(FT_Long)local_b8);
    stemWidth = (CF2_F16Dot16)FVar24;
    font->stdVW = stemWidth;
    CVar33 = (CF2_F16Dot16)local_c0;
  }
  local_88 = (CF2_BlueRec *)font->darkenParams;
  if ((int)pFVar25 < 1) {
    cf2_computeDarkening
              (iVar21,(CF2_F16Dot16)FVar23,stemWidth,&font->darkenX,0,font->stemDarkened,
               (FT_Int *)local_88);
  }
  else {
    local_a8 = (CF2_F16Dot16 *)CONCAT44(local_a8._4_4_,iVar21);
    FVar24 = FT_DivFix((long)(iVar43 << 0x10),FVar23);
    if ((long)pFVar25 <= FVar24) {
      pFVar25 = (FT_Memory)FT_DivFix((long)(iVar43 << 0x10),FVar23);
    }
    font->darkenX = 0;
    CVar33 = (CF2_F16Dot16)local_c0;
    iVar21 = (int)local_a8;
    if ((0x28e < (int)local_a8) && ((int)pFVar25 != 0)) {
      font->darkenX = (int)(((uint)((ulong)pFVar25 >> 0x1f) & 1) + (int)pFVar25) >> 1;
    }
  }
  FVar15 = (decoder->current_subfont->private_dict).standard_width;
  if ((short)FVar15 < 1) {
LAB_0022df48:
    FVar24 = 0x6e0000;
  }
  else {
    iVar43 = (int)FVar15;
    iVar22 = iVar43 * 0x20000;
    FVar24 = 0x4b0000;
    iVar40 = font->stdVW;
    if (iVar40 == iVar22 || SBORROW4(iVar40,iVar22) != iVar40 + iVar43 * -0x20000 < 0)
    goto LAB_0022df48;
  }
  FVar24 = FT_DivFix(FVar24,(FT_Long)local_b8);
  font->stdHW = (CF2_F16Dot16)FVar24;
  local_a8 = &font->darkenY;
  cf2_computeDarkening
            (iVar21,(CF2_F16Dot16)FVar23,(CF2_F16Dot16)FVar24,local_a8,CVar33,font->stemDarkened,
             &local_88->csBottomEdge);
  bVar39 = true;
  if (font->darkenX == 0) {
    bVar39 = *local_a8 != 0;
  }
  font->darkened = bVar39;
  font->reverseWinding = '\0';
  local_c0 = &font->blues;
  pPVar16 = font->decoder;
  uVar36 = 0;
  memset(local_c0,0,0x150);
  (font->blues).scale = (font->innerTransform).d;
  FVar23 = FT_DivFix((pPVar16->current_subfont->private_dict).blue_scale,0x3e80000);
  (font->blues).blueScale = (CF2_F16Dot16)FVar23;
  pCVar13 = pPVar16->current_subfont;
  FVar15 = (pCVar13->private_dict).blue_fuzz;
  (font->blues).blueShift = (int)(pCVar13->private_dict).blue_shift << 0x10;
  (font->blues).blueFuzz = (int)FVar15 << 0x10;
  bVar6 = (pCVar13->private_dict).num_blue_values;
  uVar34 = (ulong)bVar6;
  local_b8 = (FT_Memory)(ulong)(pCVar13->private_dict).num_other_blues;
  bVar7 = (pCVar13->private_dict).num_family_blues;
  bVar8 = (pCVar13->private_dict).num_family_other_blues;
  if ((pCVar13->private_dict).language_group == 1) {
    if ((uVar34 == 0) ||
       ((((bVar6 == 4 && ((short)(pCVar13->private_dict).blue_values[0] < -0x78)) &&
         ((short)(pCVar13->private_dict).blue_values[1] < -0x78)) &&
        ((0x370 < (short)(pCVar13->private_dict).blue_values[2] &&
         (0x370 < (short)(pCVar13->private_dict).blue_values[3])))))) {
      (font->blues).emBoxBottomEdge.csCoord = -0x780001;
      iVar40 = (font->blues).scale;
      lVar27 = (long)iVar40 * -0x780001;
      (font->blues).emBoxBottomEdge.dsCoord =
           ((int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000) -
           0x8000;
      (font->blues).emBoxBottomEdge.scale = iVar40;
      (font->blues).emBoxBottomEdge.flags = 0x31;
      lVar27 = (long)font->darkenY * 2 + 0x3700001;
      (font->blues).emBoxTopEdge.csCoord = (CF2_F16Dot16)lVar27;
      lVar27 = lVar27 * iVar40;
      (font->blues).emBoxTopEdge.dsCoord =
           (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000 |
           0x8000;
      (font->blues).emBoxTopEdge.scale = iVar40;
      (font->blues).emBoxTopEdge.flags = 0x32;
      (font->blues).doEmBoxHints = '\x01';
      goto LAB_0022e487;
    }
LAB_0022e154:
    uVar29 = (ulong)(font->blues).count;
    uVar36 = 0;
    uVar30 = 0;
    uVar28 = uVar36;
    do {
      iVar40 = (int)(pCVar13->private_dict).blue_values[uVar30];
      iVar43 = iVar40 * 0x10000;
      (font->blues).zone[uVar29].csBottomEdge = iVar43;
      CVar33 = (int)(pCVar13->private_dict).blue_values[uVar30 + 1] * 0x10000;
      (font->blues).zone[uVar29].csTopEdge = CVar33;
      uVar37 = CVar33 + iVar40 * -0x10000;
      if (-1 < (int)uVar37) {
        pCVar1 = (font->blues).zone + uVar29;
        bVar39 = (int)uVar36 < (int)uVar37;
        uVar36 = uVar28;
        if (bVar39) {
          uVar36 = uVar37;
        }
        if (uVar30 != 0) {
          iVar40 = *local_a8;
          (font->blues).zone[uVar29].csTopEdge = CVar33 + iVar40 * 2;
          CVar33 = iVar43 + iVar40 * 2;
          pCVar1->csBottomEdge = CVar33;
        }
        (font->blues).zone[uVar29].bottomZone = uVar30 == 0;
        pCVar1->csFlatEdge = CVar33;
        uVar28 = (int)uVar29 + 1;
        uVar29 = (ulong)uVar28;
        (font->blues).count = uVar28;
        uVar28 = uVar36;
      }
      uVar30 = uVar30 + 2;
    } while (uVar30 < uVar34);
  }
  else if (uVar34 != 0) goto LAB_0022e154;
  if (local_b8 != (FT_Memory)0x0) {
    uVar28 = (font->blues).count;
    pFVar25 = (FT_Memory)0x0;
    do {
      iVar40 = (int)(pCVar13->private_dict).other_blues[(long)pFVar25];
      (font->blues).zone[uVar28].csBottomEdge = iVar40 * 0x10000;
      iVar43 = (int)(pCVar13->private_dict).other_blues[(long)((long)&pFVar25->user + 1)] * 0x10000;
      (font->blues).zone[uVar28].csTopEdge = iVar43;
      uVar37 = iVar43 + iVar40 * -0x10000;
      if (-1 < (int)uVar37) {
        if ((int)uVar36 < (int)uVar37) {
          uVar36 = uVar37;
        }
        (font->blues).zone[uVar28].bottomZone = '\x01';
        (font->blues).zone[uVar28].csFlatEdge = iVar43;
        uVar28 = uVar28 + 1;
        (font->blues).count = uVar28;
      }
      pFVar25 = (FT_Memory)((long)&pFVar25->user + 2);
    } while (pFVar25 < local_b8);
  }
  FVar23 = FT_DivFix(0x10000,(long)(font->blues).scale);
  local_b8 = (FT_Memory)(ulong)(font->blues).count;
  if (local_b8 != (FT_Memory)0x0) {
    local_88 = (font->blues).zone;
    pFVar25 = (FT_Memory)0x0;
    do {
      iVar40 = local_88[(long)pFVar25].csFlatEdge;
      iVar43 = (int)FVar23;
      if (local_88[(long)pFVar25].bottomZone == '\0') {
        if (2 < bVar7) {
          iVar21 = *local_a8;
          iVar22 = 0x7fffffff;
          lVar27 = 0x44;
          do {
            iVar38 = (&(pCVar13->font_dict).version)[lVar27 * 2] * 0x10000 + iVar21 * 2;
            iVar35 = iVar40 - iVar38;
            iVar26 = -iVar35;
            if (0 < iVar35) {
              iVar26 = iVar35;
            }
          } while ((((iVar22 <= iVar26) || (iVar43 <= iVar26)) ||
                   (local_88[(long)pFVar25].csFlatEdge = iVar38, iVar22 = iVar26, iVar40 != iVar38))
                  && (uVar34 = lVar27 - 0x40, lVar27 = lVar27 + 2, uVar34 < bVar7));
        }
      }
      else {
        iVar21 = 0x7fffffff;
        if (bVar8 != 0) {
          uVar34 = 0;
          do {
            iVar22 = (int)(pCVar13->private_dict).family_other_blues[uVar34 + 1];
            iVar35 = iVar22 * 0x10000;
            iVar26 = iVar40 + iVar22 * -0x10000;
            iVar22 = -iVar26;
            if (0 < iVar26) {
              iVar22 = iVar26;
            }
            if (((iVar22 < iVar21) && (iVar22 < iVar43)) &&
               (local_88[(long)pFVar25].csFlatEdge = iVar35, iVar21 = iVar22, iVar40 == iVar35)) {
              iVar21 = 0;
              break;
            }
            uVar34 = uVar34 + 2;
          } while (uVar34 < bVar8);
        }
        if (1 < bVar7) {
          iVar22 = (int)(pCVar13->private_dict).family_blues[1];
          iVar40 = iVar40 + iVar22 * -0x10000;
          iVar26 = -iVar40;
          if (0 < iVar40) {
            iVar26 = iVar40;
          }
          if ((iVar26 < iVar21) && (iVar26 < iVar43)) {
            local_88[(long)pFVar25].csFlatEdge = iVar22 * 0x10000;
          }
        }
      }
      pFVar25 = (FT_Memory)((long)&pFVar25->user + 1);
    } while (pFVar25 != local_b8);
  }
  iVar40 = (font->blues).blueScale;
  if (0 < (int)uVar36) {
    FVar23 = FT_DivFix(0x10000,(ulong)uVar36);
    if (FVar23 < iVar40) {
      FVar23 = FT_DivFix(0x10000,(ulong)uVar36);
      iVar40 = (int)FVar23;
      (font->blues).blueScale = iVar40;
    }
    else {
      iVar40 = (font->blues).blueScale;
    }
  }
  pFVar19 = local_90;
  iVar43 = local_c0->scale;
  if (iVar43 < iVar40) {
    (font->blues).suppressOvershoot = '\x01';
    FVar23 = FT_MulDiv(0x999a,(long)iVar43,(long)iVar40);
    iVar40 = 0x999a - (int)FVar23;
    if (0x7ffe < iVar40) {
      iVar40 = 0x7fff;
    }
    (font->blues).boost = iVar40;
  }
  if (*pFVar19 != '\0') {
    (font->blues).boost = 0;
  }
  uVar34 = (ulong)(font->blues).count;
  if (uVar34 != 0) {
    iVar40 = (font->blues).scale;
    iVar43 = (font->blues).boost;
    lVar27 = 0;
    do {
      lVar31 = (long)*(int *)((long)&(font->blues).zone[0].csFlatEdge + lVar27) * (long)iVar40;
      iVar21 = (int)((ulong)(lVar31 + (lVar31 >> 0x3f) + 0x8000) >> 0x10);
      uVar36 = (iVar21 - iVar43) + 0x8000;
      if ((&(font->blues).zone[0].bottomZone)[lVar27] == '\0') {
        uVar36 = iVar43 + 0x8000 + iVar21;
      }
      *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar27) = uVar36 & 0xffff0000;
      lVar27 = lVar27 + 0x14;
    } while (uVar34 * 0x14 != lVar27);
  }
LAB_0022e487:
  if (font->error == 0) {
    font->reverseWinding = '\0';
    bVar39 = font->darkened == '\0';
    while( true ) {
      pPVar16 = (font->outline).decoder;
      (font->outline).root.windingMomentum = 0;
      FT_GlyphLoader_Rewind((pPVar16->builder).loader);
      cf2_interpT2CharString(font,&local_68,&(font->outline).root,&local_48,'\0',0,0,&local_9c);
      if (font->error != 0) break;
      if ((bVar39) || (-1 < (font->outline).root.windingMomentum)) {
        pPVar16 = (font->outline).decoder;
        ps_builder_close_contour((PS_Builder *)(pPVar16->builder).current);
        FT_GlyphLoader_Add((pPVar16->builder).loader);
        if (font->error != 0) {
          return 3;
        }
        pPVar16 = (font->outline).decoder;
        if ((pPVar16->builder).is_t1 == '\0') {
          *pPVar16->glyph_width = (long)(short)((uint)(local_9c + 0x8000) >> 0x10);
          return 0;
        }
        return 0;
      }
      font->reverseWinding = '\x01';
      bVar39 = true;
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_decoder_parse_charstrings( PS_Decoder*  decoder,
                                 FT_Byte*     charstring_base,
                                 FT_ULong     charstring_len )
  {
    FT_Memory  memory;
    FT_Error   error = FT_Err_Ok;
    CF2_Font   font;

    FT_Bool  is_t1 = decoder->builder.is_t1;


    FT_ASSERT( decoder &&
               ( is_t1 || decoder->cff ) );

    if ( is_t1 && !decoder->current_subfont )
    {
      FT_ERROR(( "cf2_decoder_parse_charstrings (Type 1): "
                 "SubFont missing. Use `t1_make_subfont' first\n" ));
      return FT_THROW( Invalid_Table );
    }

    memory = decoder->builder.memory;

    /* CF2 data is saved here across glyphs */
    font = (CF2_Font)decoder->cf2_instance->data;

    /* on first glyph, allocate instance structure */
    if ( !decoder->cf2_instance->data )
    {
      decoder->cf2_instance->finalizer =
        (FT_Generic_Finalizer)cf2_free_instance;

      if ( FT_ALLOC( decoder->cf2_instance->data,
                     sizeof ( CF2_FontRec ) ) )
        return FT_THROW( Out_Of_Memory );

      font = (CF2_Font)decoder->cf2_instance->data;

      font->memory = memory;

      if ( !is_t1 )
        font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;

      /* initialize a client outline, to be shared by each glyph rendered */
      cf2_outline_init( &font->outline, font->memory, &font->error );
    }

    /* save decoder; it is a stack variable and will be different on each */
    /* call                                                               */
    font->decoder         = decoder;
    font->outline.decoder = decoder;

    {
      /* build parameters for Adobe engine */

      PS_Builder*  builder = &decoder->builder;
      PS_Driver    driver  = (PS_Driver)FT_FACE_DRIVER( builder->face );

      FT_Bool  no_stem_darkening_driver =
                 driver->no_stem_darkening;
      FT_Char  no_stem_darkening_font =
                 builder->face->internal->no_stem_darkening;

      /* local error */
      FT_Error       error2 = FT_Err_Ok;
      CF2_BufferRec  buf;
      CF2_Matrix     transform;
      CF2_F16Dot16   glyphWidth;

      FT_Bool  hinted;
      FT_Bool  scaled;


      /* FreeType has already looked up the GID; convert to         */
      /* `RegionBuffer', assuming that the input has been validated */
      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( &buf );
      buf.start =
      buf.ptr   = charstring_base;
      buf.end   = FT_OFFSET( charstring_base, charstring_len );

      FT_ZERO( &transform );

      cf2_getScaleAndHintFlag( decoder,
                               &transform.a,
                               &transform.d,
                               &hinted,
                               &scaled );

      if ( is_t1 )
        font->isCFF2 = FALSE;
      else
      {
        /* copy isCFF2 boolean from TT_Face to CF2_Font */
        font->isCFF2 = ((TT_Face)builder->face)->is_cff2;
      }
      font->isT1 = is_t1;

      font->renderingFlags = 0;
      if ( hinted )
        font->renderingFlags |= CF2_FlagsHinted;
      if ( scaled && ( !no_stem_darkening_font        ||
                       ( no_stem_darkening_font < 0 &&
                         !no_stem_darkening_driver  ) ) )
        font->renderingFlags |= CF2_FlagsDarkened;

      font->darkenParams[0] = driver->darken_params[0];
      font->darkenParams[1] = driver->darken_params[1];
      font->darkenParams[2] = driver->darken_params[2];
      font->darkenParams[3] = driver->darken_params[3];
      font->darkenParams[4] = driver->darken_params[4];
      font->darkenParams[5] = driver->darken_params[5];
      font->darkenParams[6] = driver->darken_params[6];
      font->darkenParams[7] = driver->darken_params[7];

      /* now get an outline for this glyph;      */
      /* also get units per em to validate scale */
      font->unitsPerEm = (CF2_Int)cf2_getUnitsPerEm( decoder );

      if ( scaled )
      {
        error2 = cf2_checkTransform( &transform, font->unitsPerEm );
        if ( error2 )
          return error2;
      }

      error2 = cf2_getGlyphOutline( font, &buf, &transform, &glyphWidth );
      if ( error2 )
        return FT_ERR( Invalid_File_Format );

      cf2_setGlyphWidth( &font->outline, glyphWidth );

      return FT_Err_Ok;
    }
  }